

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlGlyphClassDefn::AssignGlyphAttrsToClassMembers
          (GdlGlyphClassDefn *this,GrcGlyphAttrMatrix *pgax,GdlRenderer *prndr,
          GrcLigComponentList *plclist,
          vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *vpglfaAttrs,
          int cgid,int *igid)

{
  size_type_conflict sVar1;
  reference ppGVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  undefined8 in_stack_00000008;
  size_t iglfd;
  ulong local_38;
  
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::size
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x58));
    if (sVar1 <= local_38) break;
    ppGVar2 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                        ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                         (in_RDI + 0x58),local_38);
    (*((*ppGVar2)->super_GdlDefn)._vptr_GdlDefn[8])
              (*ppGVar2,in_RSI,in_RDX,in_RCX,in_R8,(ulong)in_R9D,in_stack_00000008);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void GdlGlyphClassDefn::AssignGlyphAttrsToClassMembers(GrcGlyphAttrMatrix * pgax,
	GdlRenderer * prndr, GrcLigComponentList * plclist,
	std::vector<GdlGlyphAttrSetting *> & vpglfaAttrs, int cgid, int & igid)
{
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
	{
		m_vpglfdMembers[iglfd]->AssignGlyphAttrsToClassMembers(pgax, prndr, plclist,
			vpglfaAttrs, cgid, igid);
	}
}